

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# burstsort.cpp
# Opt level: O1

TrieNode<unsigned_char> * __thiscall
BurstSimple<unsigned_char>::operator()
          (BurstSimple<unsigned_char> *this,vector_block<unsigned_char_*,_1024U> *bucket,
          size_t depth)

{
  byte bVar1;
  TrieNode<unsigned_char> *__s;
  uchar *puVar2;
  vector_block<unsigned_char_*,_1024U> *pvVar3;
  uint uVar4;
  uint j_1;
  uint j;
  long lVar5;
  uchar **t;
  size_t index;
  ulong uVar6;
  array<unsigned_char,_64UL> cache;
  array<unsigned_char_*,_64UL> strings;
  byte abStack_270 [64];
  uchar *local_230 [64];
  
  __s = (TrieNode<unsigned_char> *)operator_new(0x820);
  uVar6 = 0;
  memset(__s,0,0x820);
  uVar4 = (*(int *)&(bucket->_index_block).
                    super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
                    super__Vector_impl_data._M_finish -
          *(int *)&(bucket->_index_block).
                   super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
                   super__Vector_impl_data._M_start) * 0x80 - bucket->_left_in_block;
  if ((uVar4 & 0xffffffc0) != 0) {
    uVar6 = 0;
    do {
      lVar5 = 0;
      do {
        puVar2 = vector_block<unsigned_char_*,_1024U>::operator[](bucket,lVar5 + uVar6);
        local_230[lVar5] = puVar2;
        if (puVar2 == (uchar *)0x0) goto LAB_0020d4ff;
        abStack_270[lVar5] = puVar2[depth];
        lVar5 = lVar5 + 1;
      } while (lVar5 != 0x40);
      t = local_230;
      lVar5 = 0;
      do {
        bVar1 = abStack_270[lVar5];
        pvVar3 = (vector_block<unsigned_char_*,_1024U> *)(__s->buckets)._M_elems[bVar1];
        if (pvVar3 == (vector_block<unsigned_char_*,_1024U> *)0x0) {
          pvVar3 = (vector_block<unsigned_char_*,_1024U> *)operator_new(0x28);
          (pvVar3->_index_block).
          super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          (pvVar3->_index_block).
          super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          (pvVar3->_index_block).
          super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          pvVar3->_insertpos = (uchar **)0x0;
          pvVar3->_left_in_block = 0;
          (__s->buckets)._M_elems[bVar1] = pvVar3;
        }
        vector_block<unsigned_char_*,_1024U>::push_back(pvVar3,t);
        lVar5 = lVar5 + 1;
        t = t + 1;
      } while (lVar5 != 0x40);
      uVar6 = uVar6 + 0x40;
    } while (uVar6 < (uVar4 & 0xffffffc0));
  }
  if ((uint)uVar6 < uVar4) {
    index = uVar6 & 0xffffffff;
    do {
      local_230[0] = vector_block<unsigned_char_*,_1024U>::operator[](bucket,index);
      if (local_230[0] == (uchar *)0x0) {
LAB_0020d4ff:
        __assert_fail("ptr",
                      "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/util/get_char.h"
                      ,0x26,"unsigned char get_char(unsigned char *, size_t)");
      }
      bVar1 = local_230[0][depth];
      pvVar3 = (vector_block<unsigned_char_*,_1024U> *)(__s->buckets)._M_elems[bVar1];
      if (pvVar3 == (vector_block<unsigned_char_*,_1024U> *)0x0) {
        pvVar3 = (vector_block<unsigned_char_*,_1024U> *)operator_new(0x28);
        (pvVar3->_index_block).
        super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        (pvVar3->_index_block).
        super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        (pvVar3->_index_block).
        super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        pvVar3->_insertpos = (uchar **)0x0;
        pvVar3->_left_in_block = 0;
        (__s->buckets)._M_elems[bVar1] = pvVar3;
      }
      vector_block<unsigned_char_*,_1024U>::push_back(pvVar3,local_230);
      index = index + 1;
    } while (index < uVar4);
  }
  return __s;
}

Assistant:

TrieNode<CharT>*
	operator()(const BucketT& bucket, size_t depth) const
	{
		TrieNode<CharT>* new_node = new TrieNode<CharT>;
		const unsigned bucket_size = bucket.size();
		// Use a small cache to reduce memory stalls. Also cache the
		// string pointers, in case the indexing operation of the
		// container is expensive.
		unsigned i=0;
		for (; i < bucket_size-bucket_size%64; i+=64) {
			array<CharT, 64> cache;
			array<unsigned char*, 64> strings;
			for (unsigned j=0; j < 64; ++j) {
				strings[j] = bucket[i+j];
				cache[j] = get_char<CharT>(strings[j], depth);
			}
			for (unsigned j=0; j < 64; ++j) {
				const CharT ch = cache[j];
				BucketT* sub_bucket = static_cast<BucketT*>(
					new_node->buckets[ch]);
				if (not sub_bucket) {
					new_node->buckets[ch] = sub_bucket
						= new BucketT;
				}
				sub_bucket->push_back(strings[j]);
			}
		}
		for (; i < bucket_size; ++i) {
			unsigned char* ptr = bucket[i];
			const CharT ch = get_char<CharT>(ptr, depth);
			BucketT* sub_bucket = static_cast<BucketT*>(
				new_node->buckets[ch]);
			if (not sub_bucket) {
				new_node->buckets[ch] = sub_bucket
					= new BucketT;
			}
			sub_bucket->push_back(ptr);
		}
		return new_node;
	}